

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IImage.h
# Opt level: O1

u32 irr::video::IImage::getBitsPerPixelFromFormat(ECOLOR_FORMAT format)

{
  u32 uVar1;
  
  uVar1 = 0;
  if (format < ECF_UNKNOWN) {
    uVar1 = *(u32 *)(&DAT_00103dfc + (ulong)format * 4);
  }
  return uVar1;
}

Assistant:

static u32 getBitsPerPixelFromFormat(const ECOLOR_FORMAT format)
	{
		switch (format) {
		case ECF_A1R5G5B5:
			return 16;
		case ECF_R5G6B5:
			return 16;
		case ECF_R8G8B8:
			return 24;
		case ECF_A8R8G8B8:
			return 32;
		case ECF_D16:
			return 16;
		case ECF_D32:
			return 32;
		case ECF_D24S8:
			return 32;
		case ECF_R8:
			return 8;
		case ECF_R8G8:
			return 16;
		case ECF_R16:
			return 16;
		case ECF_R16G16:
			return 32;
		case ECF_R16F:
			return 16;
		case ECF_G16R16F:
			return 32;
		case ECF_A16B16G16R16F:
			return 64;
		case ECF_R32F:
			return 32;
		case ECF_G32R32F:
			return 64;
		case ECF_A32B32G32R32F:
			return 128;
		default:
			return 0;
		}
	}